

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O2

bool amrex::Amr::isStateSmallPlotVar(string *name)

{
  __type _Var1;
  undefined8 *puVar2;
  const_iterator End;
  
  puVar2 = &state_small_plot_vars_abi_cxx11_;
  do {
    puVar2 = (undefined8 *)*puVar2;
    if (puVar2 == &state_small_plot_vars_abi_cxx11_) break;
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (puVar2 + 2),name);
  } while (!_Var1);
  return puVar2 != &state_small_plot_vars_abi_cxx11_;
}

Assistant:

bool
Amr::isStateSmallPlotVar (const std::string& name)
{
    for (std::list<std::string>::const_iterator li = state_small_plot_vars.begin(), End = state_small_plot_vars.end();
         li != End;
         ++li)
    {
        if (*li == name)
            return true;
    }
    return false;
}